

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i64 gen_mulu_i64_i32(TCGContext_conflict1 *tcg_ctx,TCGv_i32 a,TCGv_i32 b)

{
  TCGv_i32 rl;
  TCGv_i32 rh;
  TCGv_i64 dest;
  TCGv_i64 ret;
  TCGv_i32 hi;
  TCGv_i32 lo;
  TCGv_i32 b_local;
  TCGv_i32 a_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  rl = tcg_temp_new_i32(tcg_ctx);
  rh = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_mulu2_i32_aarch64(tcg_ctx,rl,rh,a,b);
  tcg_temp_free_i32(tcg_ctx,a);
  tcg_temp_free_i32(tcg_ctx,b);
  dest = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_concat_i32_i64_aarch64(tcg_ctx,dest,rl,rh);
  tcg_temp_free_i32(tcg_ctx,rl);
  tcg_temp_free_i32(tcg_ctx,rh);
  return dest;
}

Assistant:

static TCGv_i64 gen_mulu_i64_i32(TCGContext *tcg_ctx, TCGv_i32 a, TCGv_i32 b)
{
    TCGv_i32 lo = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 hi = tcg_temp_new_i32(tcg_ctx);
    TCGv_i64 ret;

    tcg_gen_mulu2_i32(tcg_ctx, lo, hi, a, b);
    tcg_temp_free_i32(tcg_ctx, a);
    tcg_temp_free_i32(tcg_ctx, b);

    ret = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_concat_i32_i64(tcg_ctx, ret, lo, hi);
    tcg_temp_free_i32(tcg_ctx, lo);
    tcg_temp_free_i32(tcg_ctx, hi);

    return ret;
}